

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O0

QString * __thiscall QEdidParser::parseEdidString(QEdidParser *this,quint8 *data)

{
  qsizetype qVar1;
  char *pcVar2;
  char *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QByteArray buffer;
  QByteArray *in_stack_ffffffffffffff98;
  int local_3c;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_20,in_RDX,0xd);
  local_3c = 0;
  do {
    qVar1 = QByteArray::size(&local_20);
    if (qVar1 <= local_3c) {
LAB_00b7fcfd:
      QString::fromLatin1<void>(&local_20);
      QByteArray::~QByteArray((QByteArray *)0xb7fd1b);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    pcVar2 = QByteArray::operator[](in_stack_ffffffffffffff98,0xb7fc92);
    if (*pcVar2 == '\n') {
      QByteArray::truncate((longlong)&local_20);
      goto LAB_00b7fcfd;
    }
    pcVar2 = QByteArray::operator[](in_stack_ffffffffffffff98,0xb7fcba);
    if (*pcVar2 < ' ') {
LAB_00b7fcd9:
      pcVar2 = QByteArray::operator[](in_stack_ffffffffffffff98,0xb7fce8);
      *pcVar2 = '-';
    }
    else {
      pcVar2 = QByteArray::operator[](in_stack_ffffffffffffff98,0xb7fcd1);
      if ('~' < *pcVar2) goto LAB_00b7fcd9;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

QString QEdidParser::parseEdidString(const quint8 *data)
{
    QByteArray buffer(reinterpret_cast<const char *>(data), 13);

    for (int i = 0; i < buffer.size(); ++i) {
        // If there are less than 13 characters in the string, the string
        // is terminated with the ASCII code ‘0Ah’ (line feed) and padded
        // with ASCII code ‘20h’ (space). See EDID 1.4, sections 3.10.3.1,
        // 3.10.3.2, and 3.10.3.4.
        if (buffer[i] == '\n') {
            buffer.truncate(i);
            break;
        }

        // Replace non-printable characters with dash
        if (buffer[i] < '\040' || buffer[i] > '\176')
            buffer[i] = '-';
    }

    return QString::fromLatin1(buffer);
}